

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O3

void CreateBackwardReferencesNH40
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command_conflict *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  uint16_t *puVar4;
  BrotliDictionary *pBVar5;
  int iVar6;
  bool bVar7;
  size_t sVar8;
  uint32_t uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int *piVar14;
  ulong uVar15;
  byte bVar16;
  ushort uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  ushort uVar23;
  long lVar24;
  int *piVar25;
  uint8_t *puVar26;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  size_t sVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  uint8_t uVar36;
  uint uVar37;
  bool bVar38;
  ushort uVar39;
  ulong uVar40;
  uint uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong local_150;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  size_t local_110;
  ulong local_108;
  int local_f4;
  ulong local_d8;
  Command_conflict *local_d0;
  ulong local_b8;
  ulong local_b0;
  ulong local_98;
  HasherCommon *self;
  
  uVar3 = (position - 3) + num_bytes;
  sVar31 = position;
  if (3 < num_bytes) {
    sVar31 = uVar3;
  }
  lVar32 = 0x200;
  if (params->quality < 9) {
    lVar32 = 0x40;
  }
  local_110 = *last_insert_len;
  uVar1 = position + num_bytes;
  if (uVar1 <= position + 4) {
    local_d0 = commands;
LAB_001141bc:
    *last_insert_len = (local_110 + uVar1) - position;
    *num_commands = *num_commands + ((long)local_d0 - (long)commands >> 4);
    return;
  }
  uVar42 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  local_108 = lVar32 + position;
  lVar2 = position - 1;
  local_d0 = commands;
  uVar45 = position;
LAB_00112ee9:
  local_d8 = uVar1 - uVar45;
  uVar27 = uVar42;
  if (uVar45 < uVar42) {
    uVar27 = uVar45;
  }
  uVar30 = (params->dist).max_distance;
  uVar19 = uVar45 & ringbuffer_mask;
  piVar14 = (int *)(ringbuffer + uVar19);
  uVar37 = (uint)(*(int *)(ringbuffer + uVar19) * 0x1e35a7bd) >> 0x11;
  uVar15 = (ulong)((uint)local_d8 & 7);
  uVar11 = local_d8 & 0xfffffffffffffff8;
  local_130 = 0x7e4;
  uVar13 = 0;
  lVar12 = 0;
  local_150 = 0;
  local_140 = 0;
  do {
    uVar29 = (ulong)dist_cache[lVar12];
    uVar20 = uVar45 - uVar29;
    uVar36 = (uint8_t)uVar37;
    if ((((lVar12 == 0) || (hasher[(uVar20 & 0xffff) + 0x30028] == uVar36)) && (uVar29 <= uVar27))
       && (uVar20 < uVar45)) {
      if (7 < local_d8) {
        lVar24 = 0;
        uVar34 = 0;
LAB_00112fc2:
        if (*(ulong *)(piVar14 + uVar34 * 2) ==
            *(ulong *)(ringbuffer + uVar34 * 8 + (uVar20 & ringbuffer_mask))) goto code_r0x00112fd0;
        uVar34 = *(ulong *)(ringbuffer + uVar34 * 8 + (uVar20 & ringbuffer_mask)) ^
                 *(ulong *)(piVar14 + uVar34 * 2);
        uVar20 = 0;
        if (uVar34 != 0) {
          for (; (uVar34 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
          }
        }
        uVar34 = (uVar20 >> 3 & 0x1fffffff) - lVar24;
        goto LAB_00112ff8;
      }
      piVar25 = piVar14;
      uVar40 = 0;
LAB_0011305f:
      uVar34 = uVar40;
      if (uVar15 != 0) {
        uVar35 = uVar15 | uVar40;
        uVar43 = uVar15;
        do {
          uVar34 = uVar40;
          if (ringbuffer[uVar40 + (uVar20 & ringbuffer_mask)] != (uint8_t)*piVar25) break;
          piVar25 = (int *)((long)piVar25 + 1);
          uVar40 = uVar40 + 1;
          uVar43 = uVar43 - 1;
          uVar34 = uVar35;
        } while (uVar43 != 0);
      }
LAB_00112ff8:
      if ((1 < uVar34) && (uVar20 = uVar34 * 0x87 + 0x78f, local_130 < uVar20)) {
        if (lVar12 != 0) {
          uVar20 = uVar20 - ((0x1ca10U >> ((byte)lVar12 & 2) & 4) + 0x27);
        }
        if (local_130 < uVar20) {
          uVar13 = uVar34;
          local_150 = uVar34;
          local_140 = uVar29;
          local_130 = uVar20;
        }
      }
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  uVar29 = (ulong)uVar37;
  lVar12 = *(long *)(hasher + 0x80030);
  uVar20 = uVar45 - *(uint *)(hasher + uVar29 * 4 + 0x28);
  uVar23 = *(ushort *)(hasher + uVar29 * 2 + 0x20028);
  if (lVar12 != 0) {
    uVar40 = 0;
    lVar24 = lVar12;
    uVar34 = uVar20;
    uVar39 = uVar23;
    do {
      uVar40 = uVar34 + uVar40;
      if (uVar27 < uVar40) break;
      if (uVar13 + uVar19 <= ringbuffer_mask) {
        uVar34 = uVar45 - uVar40 & ringbuffer_mask;
        if ((uVar34 + uVar13 <= ringbuffer_mask) &&
           (ringbuffer[uVar13 + uVar19] == ringbuffer[uVar34 + uVar13])) {
          if (7 < local_d8) {
            lVar22 = 0;
            uVar43 = 0;
LAB_00113144:
            if (*(ulong *)(piVar14 + uVar43 * 2) == *(ulong *)(ringbuffer + uVar43 * 8 + uVar34))
            goto code_r0x00113152;
            uVar43 = *(ulong *)(ringbuffer + uVar43 * 8 + uVar34) ^ *(ulong *)(piVar14 + uVar43 * 2)
            ;
            uVar34 = 0;
            if (uVar43 != 0) {
              for (; (uVar43 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
              }
            }
            uVar43 = (uVar34 >> 3 & 0x1fffffff) - lVar22;
            goto LAB_00113184;
          }
          piVar25 = piVar14;
          uVar35 = 0;
LAB_001131ef:
          uVar43 = uVar35;
          if (uVar15 != 0) {
            uVar33 = uVar15 | uVar35;
            uVar44 = uVar15;
            do {
              uVar43 = uVar35;
              if (ringbuffer[uVar35 + uVar34] != (uint8_t)*piVar25) break;
              piVar25 = (int *)((long)piVar25 + 1);
              uVar35 = uVar35 + 1;
              uVar44 = uVar44 - 1;
              uVar43 = uVar33;
            } while (uVar44 != 0);
          }
LAB_00113184:
          if (3 < uVar43) {
            iVar18 = 0x1f;
            if ((uint)uVar40 != 0) {
              for (; (uint)uVar40 >> iVar18 == 0; iVar18 = iVar18 + -1) {
              }
            }
            uVar34 = (ulong)(iVar18 * -0x1e + 0x780) + uVar43 * 0x87;
            if (local_130 < uVar34) {
              uVar13 = uVar43;
              local_150 = uVar43;
              local_140 = uVar40;
              local_130 = uVar34;
            }
          }
        }
      }
      uVar34 = (ulong)uVar39;
      uVar39 = *(ushort *)(hasher + uVar34 * 4 + 0x4002a);
      uVar34 = (ulong)*(ushort *)(hasher + uVar34 * 4 + 0x40028);
      lVar24 = lVar24 + -1;
    } while (lVar24 != 0);
  }
  uVar39 = *(ushort *)(hasher + 0x80028);
  uVar17 = uVar39 + 1;
  *(ushort *)(hasher + 0x80028) = uVar17;
  hasher[(uVar45 & 0xffff) + 0x30028] = uVar36;
  if (0xfffe < uVar20) {
    uVar20 = 0xffff;
  }
  *(short *)(hasher + (ulong)uVar39 * 4 + 0x40028) = (short)uVar20;
  *(ushort *)(hasher + (ulong)uVar39 * 4 + 0x4002a) = uVar23;
  *(int *)(hasher + uVar29 * 4 + 0x28) = (int)uVar45;
  *(ushort *)(hasher + uVar29 * 2 + 0x20028) = uVar39;
  if (local_130 == 0x7e4) {
    uVar11 = *(ulong *)(hasher + 0x18);
    local_130 = *(ulong *)(hasher + 0x20);
    if (uVar11 >> 7 <= local_130) {
      uVar19 = (ulong)((uint)(*piVar14 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      puVar4 = (params->dictionary).hash_table;
      uVar13 = 0x7e4;
      local_f4 = 0;
      bVar38 = true;
LAB_001132ed:
      uVar23 = puVar4[uVar19];
      uVar11 = uVar11 + 1;
      *(ulong *)(hasher + 0x18) = uVar11;
      if ((ulong)uVar23 != 0) {
        uVar37 = uVar23 & 0x1f;
        uVar15 = (ulong)uVar37;
        if (local_d8 < uVar15) goto LAB_0011343e;
        pBVar5 = (params->dictionary).words;
        puVar26 = pBVar5->data + (ulong)pBVar5->offsets_by_length[uVar15] + uVar15 * (uVar23 >> 5);
        if (7 < uVar15) {
          uVar20 = (ulong)(uVar23 & 0x18);
          lVar24 = 0;
          uVar29 = 0;
LAB_00113370:
          if (*(ulong *)(puVar26 + uVar29 * 8) == *(ulong *)(piVar14 + uVar29 * 2))
          goto code_r0x0011337e;
          uVar29 = *(ulong *)(piVar14 + uVar29 * 2) ^ *(ulong *)(puVar26 + uVar29 * 8);
          uVar20 = 0;
          if (uVar29 != 0) {
            for (; (uVar29 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
            }
          }
          uVar29 = (uVar20 >> 3 & 0x1fffffff) - lVar24;
          goto LAB_001133b1;
        }
        uVar20 = 0;
        goto LAB_001134bc;
      }
      goto LAB_0011343e;
    }
  }
  else {
    local_f4 = 0;
    uVar13 = local_130;
LAB_00113505:
    if (0x7e4 < uVar13) {
      uVar27 = local_110 + 4;
      uVar30 = (lVar2 + num_bytes) - uVar45;
      iVar18 = 0;
      local_130 = uVar13;
      local_98 = local_140;
LAB_0011354a:
      local_d8 = local_d8 - 1;
      uVar13 = local_150 - 1;
      if (local_d8 <= local_150 - 1) {
        uVar13 = local_d8;
      }
      if (4 < params->quality) {
        uVar13 = 0;
      }
      uVar11 = uVar45 + 1;
      local_140 = uVar42;
      if (uVar11 < uVar42) {
        local_140 = uVar11;
      }
      uVar19 = (params->dist).max_distance;
      uVar20 = uVar11 & ringbuffer_mask;
      piVar14 = (int *)(ringbuffer + uVar20);
      uVar37 = (uint)(*(int *)(ringbuffer + uVar20) * 0x1e35a7bd) >> 0x11;
      uVar29 = (ulong)((uint)local_d8 & 7);
      uVar15 = 0x7e4;
      lVar24 = 0;
      local_138 = 0;
      local_b8 = 0;
LAB_001135f6:
      uVar40 = (ulong)dist_cache[lVar24];
      uVar34 = uVar11 - uVar40;
      uVar36 = (uint8_t)uVar37;
      if (((lVar24 == 0) || (hasher[(uVar34 & 0xffff) + 0x30028] == uVar36)) &&
         ((uVar40 <= local_140 && (uVar34 < uVar11)))) {
        uVar43 = uVar29;
        if (7 < local_d8) {
          lVar22 = 0;
          uVar35 = 0;
LAB_00113642:
          if (*(ulong *)(piVar14 + uVar35 * 2) ==
              *(ulong *)(ringbuffer + uVar35 * 8 + (uVar34 & ringbuffer_mask)))
          goto code_r0x00113654;
          uVar43 = *(ulong *)(ringbuffer + uVar35 * 8 + (uVar34 & ringbuffer_mask)) ^
                   *(ulong *)(piVar14 + uVar35 * 2);
          uVar34 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
            }
          }
          uVar35 = (uVar34 >> 3 & 0x1fffffff) - lVar22;
          goto LAB_0011367f;
        }
        uVar35 = 0;
        piVar25 = piVar14;
        goto joined_r0x001136f5;
      }
      goto LAB_001136d7;
    }
  }
  local_110 = local_110 + 1;
  position = uVar45 + 1;
  if (local_108 < position) {
    if (position <= (uint)((int)lVar32 * 4) + local_108) {
      uVar27 = uVar45 + 9;
      if (uVar3 <= uVar45 + 9) {
        uVar27 = uVar3;
      }
      if (position < uVar27) {
        do {
          uVar37 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar30 = (ulong)uVar37;
          uVar45 = position - *(uint *)(hasher + uVar30 * 4 + 0x28);
          hasher[(position & 0xffff) + 0x30028] = (uint8_t)uVar37;
          if (0xfffe < uVar45) {
            uVar45 = 0xffff;
          }
          uVar39 = uVar17 + 1;
          *(short *)(hasher + (ulong)uVar17 * 4 + 0x40028) = (short)uVar45;
          *(undefined2 *)(hasher + (ulong)uVar17 * 4 + 0x4002a) =
               *(undefined2 *)(hasher + uVar30 * 2 + 0x20028);
          *(int *)(hasher + uVar30 * 4 + 0x28) = (int)position;
          *(ushort *)(hasher + uVar30 * 2 + 0x20028) = uVar17;
          local_110 = local_110 + 2;
          position = position + 2;
          uVar17 = uVar39;
        } while (position < uVar27);
        goto LAB_00114136;
      }
      goto LAB_00114142;
    }
    uVar27 = uVar45 + 0x11;
    if (uVar1 - 4 <= uVar45 + 0x11) {
      uVar27 = uVar1 - 4;
    }
    if (uVar27 <= position) goto LAB_00114142;
    do {
      uVar37 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
      uVar30 = (ulong)uVar37;
      uVar45 = position - *(uint *)(hasher + uVar30 * 4 + 0x28);
      hasher[(position & 0xffff) + 0x30028] = (uint8_t)uVar37;
      if (0xfffe < uVar45) {
        uVar45 = 0xffff;
      }
      uVar39 = uVar17 + 1;
      *(short *)(hasher + (ulong)uVar17 * 4 + 0x40028) = (short)uVar45;
      *(undefined2 *)(hasher + (ulong)uVar17 * 4 + 0x4002a) =
           *(undefined2 *)(hasher + uVar30 * 2 + 0x20028);
      *(int *)(hasher + uVar30 * 4 + 0x28) = (int)position;
      *(ushort *)(hasher + uVar30 * 2 + 0x20028) = uVar17;
      local_110 = local_110 + 4;
      position = position + 4;
      uVar17 = uVar39;
    } while (position < uVar27);
    goto LAB_00114136;
  }
  goto LAB_00114142;
code_r0x00112fd0:
  uVar34 = uVar34 + 1;
  lVar24 = lVar24 + -8;
  piVar25 = (int *)(uVar11 + (long)piVar14);
  uVar40 = uVar11;
  if (local_d8 >> 3 == uVar34) goto LAB_0011305f;
  goto LAB_00112fc2;
code_r0x00113152:
  uVar43 = uVar43 + 1;
  lVar22 = lVar22 + -8;
  piVar25 = (int *)(uVar11 + (long)piVar14);
  uVar35 = uVar11;
  if (local_d8 >> 3 == uVar43) goto LAB_001131ef;
  goto LAB_00113144;
code_r0x0011337e:
  uVar29 = uVar29 + 1;
  lVar24 = lVar24 + -8;
  if (uVar37 >> 3 == uVar29) goto code_r0x0011338a;
  goto LAB_00113370;
code_r0x0011338a:
  puVar26 = puVar26 + -lVar24;
LAB_001134bc:
  uVar34 = (ulong)uVar23 & 7;
  uVar29 = uVar20;
  if ((uVar23 & 7) != 0) {
    uVar40 = uVar20 | uVar34;
    do {
      uVar29 = uVar20;
      if (*(uint8_t *)((long)piVar14 + uVar20) != *puVar26) break;
      puVar26 = puVar26 + 1;
      uVar20 = uVar20 + 1;
      uVar34 = uVar34 - 1;
      uVar29 = uVar40;
    } while (uVar34 != 0);
  }
LAB_001133b1:
  if (((uVar29 != 0) && (uVar15 < (params->dictionary).cutoffTransformsCount + uVar29)) &&
     (uVar15 = (ulong)(uVar23 >> 5) + uVar27 + 1 +
               ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                              ((char)(uVar15 - uVar29) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar15 - uVar29) * 4 << (pBVar5->size_bits_by_length[uVar15] & 0x3f)),
     uVar15 <= uVar30)) {
    iVar18 = 0x1f;
    if ((uint)uVar15 != 0) {
      for (; (uint)uVar15 >> iVar18 == 0; iVar18 = iVar18 + -1) {
      }
    }
    uVar20 = (uVar29 * 0x87 - (ulong)(uint)(iVar18 * 0x1e)) + 0x780;
    if (uVar13 <= uVar20) {
      local_f4 = uVar37 - (int)uVar29;
      local_130 = local_130 + 1;
      *(ulong *)(hasher + 0x20) = local_130;
      local_140 = uVar15;
      local_150 = uVar29;
      uVar13 = uVar20;
    }
  }
LAB_0011343e:
  uVar19 = uVar19 + 1;
  bVar7 = !bVar38;
  bVar38 = false;
  if (bVar7) goto LAB_00113505;
  goto LAB_001132ed;
code_r0x00113654:
  uVar35 = uVar35 + 1;
  lVar22 = lVar22 + -8;
  if (uVar30 >> 3 == uVar35) goto code_r0x00113662;
  goto LAB_00113642;
code_r0x00113662:
  uVar35 = -lVar22;
  piVar25 = (int *)((long)piVar14 - lVar22);
joined_r0x001136f5:
  for (; (uVar43 != 0 && (ringbuffer[uVar35 + (uVar34 & ringbuffer_mask)] == (uint8_t)*piVar25));
      uVar35 = uVar35 + 1) {
    piVar25 = (int *)((long)piVar25 + 1);
    uVar43 = uVar43 - 1;
  }
LAB_0011367f:
  if ((1 < uVar35) && (uVar34 = uVar35 * 0x87 + 0x78f, uVar15 < uVar34)) {
    if (lVar24 != 0) {
      uVar34 = uVar34 - ((0x1ca10U >> ((byte)lVar24 & 2) & 4) + 0x27);
    }
    if (uVar15 < uVar34) {
      uVar15 = uVar34;
      uVar13 = uVar35;
      local_138 = uVar35;
      local_b8 = uVar40;
    }
  }
LAB_001136d7:
  lVar24 = lVar24 + 1;
  if (lVar24 == 4) goto LAB_00113714;
  goto LAB_001135f6;
LAB_00113714:
  uVar34 = (ulong)uVar37;
  uVar40 = uVar11 - *(uint *)(hasher + uVar34 * 4 + 0x28);
  uVar23 = *(ushort *)(hasher + uVar34 * 2 + 0x20028);
  if (lVar12 != 0) {
    uVar35 = 0;
    uVar43 = uVar40;
    lVar24 = lVar12;
    uVar39 = uVar23;
LAB_00113755:
    uVar35 = uVar43 + uVar35;
    if (uVar35 <= local_140) {
      if (uVar13 + uVar20 <= ringbuffer_mask) {
        uVar43 = uVar11 - uVar35 & ringbuffer_mask;
        if ((ringbuffer_mask < uVar43 + uVar13) ||
           (ringbuffer[uVar13 + uVar20] != ringbuffer[uVar43 + uVar13])) goto LAB_00113845;
        uVar44 = uVar29;
        if (7 < local_d8) {
          lVar22 = 0;
          uVar33 = 0;
LAB_001137b3:
          if (*(ulong *)(piVar14 + uVar33 * 2) == *(ulong *)(ringbuffer + uVar33 * 8 + uVar43))
          goto code_r0x001137c5;
          uVar44 = *(ulong *)(ringbuffer + uVar33 * 8 + uVar43) ^ *(ulong *)(piVar14 + uVar33 * 2);
          uVar43 = 0;
          if (uVar44 != 0) {
            for (; (uVar44 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
            }
          }
          uVar33 = (uVar43 >> 3 & 0x1fffffff) - lVar22;
          goto LAB_0011380a;
        }
        uVar33 = 0;
        piVar25 = piVar14;
        goto joined_r0x00113880;
      }
      goto LAB_00113845;
    }
  }
LAB_001138a4:
  *(ushort *)(hasher + 0x80028) = uVar17 + 1;
  if (0xfffe < uVar40) {
    uVar40 = 0xffff;
  }
  hasher[(uVar11 & 0xffff) + 0x30028] = uVar36;
  *(short *)(hasher + (ulong)uVar17 * 4 + 0x40028) = (short)uVar40;
  *(ushort *)(hasher + (ulong)uVar17 * 4 + 0x4002a) = uVar23;
  *(int *)(hasher + uVar34 * 4 + 0x28) = (int)uVar11;
  *(ushort *)(hasher + uVar34 * 2 + 0x20028) = uVar17;
  iVar21 = 0;
  if (uVar15 == 0x7e4) {
    uVar13 = *(ulong *)(hasher + 0x18);
    local_b0 = *(ulong *)(hasher + 0x20);
    uVar15 = 0x7e4;
    if (uVar13 >> 7 <= local_b0) {
      uVar20 = (ulong)((uint)(*piVar14 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      puVar4 = (params->dictionary).hash_table;
      iVar21 = 0;
      uVar15 = 0x7e4;
      bVar38 = true;
LAB_00113a0e:
      uVar23 = puVar4[uVar20];
      uVar13 = uVar13 + 1;
      *(ulong *)(hasher + 0x18) = uVar13;
      if ((ulong)uVar23 != 0) {
        uVar37 = uVar23 & 0x1f;
        uVar29 = (ulong)uVar37;
        if (local_d8 < uVar29) goto LAB_00113a34;
        pBVar5 = (params->dictionary).words;
        puVar26 = pBVar5->data + (ulong)pBVar5->offsets_by_length[uVar29] + uVar29 * (uVar23 >> 5);
        if (7 < uVar29) {
          uVar34 = (ulong)(uVar23 & 0x18);
          lVar24 = 0;
          uVar40 = 0;
LAB_00113a98:
          if (*(ulong *)(puVar26 + uVar40 * 8) == *(ulong *)(piVar14 + uVar40 * 2))
          goto code_r0x00113aaa;
          uVar40 = *(ulong *)(piVar14 + uVar40 * 2) ^ *(ulong *)(puVar26 + uVar40 * 8);
          uVar34 = 0;
          if (uVar40 != 0) {
            for (; (uVar40 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
            }
          }
          uVar40 = (uVar34 >> 3 & 0x1fffffff) - lVar24;
          goto LAB_00113aef;
        }
        uVar34 = 0;
        goto LAB_00113b97;
      }
      goto LAB_00113a34;
    }
  }
LAB_0011394c:
  if (uVar15 < local_130 + 0xaf) {
    local_138 = local_150;
    local_b8 = local_98;
    uVar11 = uVar45;
    iVar21 = local_f4;
    local_140 = uVar42;
    sVar8 = local_110;
    if (uVar45 < uVar42) {
      local_140 = uVar45;
    }
    goto LAB_00113dd1;
  }
  sVar8 = uVar27;
  if (iVar18 == 3) goto LAB_00113dd1;
  local_110 = local_110 + 1;
  iVar18 = iVar18 + 1;
  uVar13 = uVar45 + 5;
  uVar30 = uVar30 - 1;
  uVar45 = uVar11;
  local_150 = local_138;
  local_130 = uVar15;
  sVar8 = local_110;
  local_f4 = iVar21;
  local_98 = local_b8;
  uVar17 = uVar17 + 1;
  if (uVar1 <= uVar13) goto LAB_00113dd1;
  goto LAB_0011354a;
code_r0x001137c5:
  uVar33 = uVar33 + 1;
  lVar22 = lVar22 + -8;
  if (uVar30 >> 3 == uVar33) goto code_r0x001137d3;
  goto LAB_001137b3;
code_r0x001137d3:
  uVar33 = -lVar22;
  piVar25 = (int *)((long)piVar14 - lVar22);
joined_r0x00113880:
  for (; (uVar44 != 0 && (ringbuffer[uVar33 + uVar43] == (uint8_t)*piVar25)); uVar33 = uVar33 + 1) {
    uVar44 = uVar44 - 1;
    piVar25 = (int *)((long)piVar25 + 1);
  }
LAB_0011380a:
  if (3 < uVar33) {
    iVar21 = 0x1f;
    if ((uint)uVar35 != 0) {
      for (; (uint)uVar35 >> iVar21 == 0; iVar21 = iVar21 + -1) {
      }
    }
    uVar43 = (ulong)(iVar21 * -0x1e + 0x780) + uVar33 * 0x87;
    if (uVar15 < uVar43) {
      uVar15 = uVar43;
      local_138 = uVar33;
      uVar13 = uVar33;
      local_b8 = uVar35;
    }
  }
LAB_00113845:
  uVar43 = (ulong)uVar39;
  uVar39 = *(ushort *)(hasher + uVar43 * 4 + 0x4002a);
  uVar43 = (ulong)*(ushort *)(hasher + uVar43 * 4 + 0x40028);
  lVar24 = lVar24 + -1;
  if (lVar24 == 0) goto LAB_001138a4;
  goto LAB_00113755;
code_r0x00113aaa:
  uVar40 = uVar40 + 1;
  lVar24 = lVar24 + -8;
  if (uVar37 >> 3 == uVar40) goto code_r0x00113ab6;
  goto LAB_00113a98;
code_r0x00113ab6:
  puVar26 = puVar26 + -lVar24;
LAB_00113b97:
  uVar43 = (ulong)uVar23 & 7;
  uVar40 = uVar34;
  if ((uVar23 & 7) != 0) {
    uVar35 = uVar34 | uVar43;
    do {
      uVar40 = uVar34;
      if (*(uint8_t *)((long)piVar14 + uVar34) != *puVar26) break;
      puVar26 = puVar26 + 1;
      uVar34 = uVar34 + 1;
      uVar43 = uVar43 - 1;
      uVar40 = uVar35;
    } while (uVar43 != 0);
  }
LAB_00113aef:
  if (((uVar40 != 0) && (uVar29 < (params->dictionary).cutoffTransformsCount + uVar40)) &&
     (uVar29 = (ulong)(uVar23 >> 5) + local_140 + 1 +
               ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                              ((char)(uVar29 - uVar40) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar29 - uVar40) * 4 << (pBVar5->size_bits_by_length[uVar29] & 0x3f)),
     uVar29 <= uVar19)) {
    iVar6 = 0x1f;
    if ((uint)uVar29 != 0) {
      for (; (uint)uVar29 >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    uVar34 = (uVar40 * 0x87 - (ulong)(uint)(iVar6 * 0x1e)) + 0x780;
    if (uVar15 <= uVar34) {
      iVar21 = uVar37 - (int)uVar40;
      local_b0 = local_b0 + 1;
      *(ulong *)(hasher + 0x20) = local_b0;
      uVar15 = uVar34;
      local_138 = uVar40;
      local_b8 = uVar29;
    }
  }
LAB_00113a34:
  uVar20 = uVar20 + 1;
  bVar7 = !bVar38;
  bVar38 = false;
  if (bVar7) goto LAB_0011394c;
  goto LAB_00113a0e;
LAB_00113dd1:
  local_110 = sVar8;
  if (local_140 < local_b8) {
LAB_00113ddb:
    uVar45 = local_b8 + 0xf;
  }
  else {
    if (local_b8 == (long)*dist_cache) {
      uVar45 = 0;
      goto LAB_00113e2c;
    }
    uVar45 = 1;
    if (local_b8 != (long)dist_cache[1]) {
      uVar45 = (local_b8 + 3) - (long)*dist_cache;
      if (uVar45 < 7) {
        bVar16 = (byte)((int)uVar45 << 2);
        uVar37 = 0x9750468;
      }
      else {
        uVar45 = (local_b8 + 3) - (long)dist_cache[1];
        if (6 < uVar45) {
          uVar45 = 2;
          if ((local_b8 != (long)dist_cache[2]) && (uVar45 = 3, local_b8 != (long)dist_cache[3]))
          goto LAB_00113ddb;
          goto LAB_00113ddf;
        }
        bVar16 = (byte)((int)uVar45 << 2);
        uVar37 = 0xfdb1ace;
      }
      uVar45 = (ulong)(uVar37 >> (bVar16 & 0x1f) & 0xf);
    }
  }
LAB_00113ddf:
  if ((local_b8 <= local_140) && (uVar45 != 0)) {
    dist_cache[3] = dist_cache[2];
    *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
    *dist_cache = (int)local_b8;
  }
LAB_00113e2c:
  uVar37 = (uint)local_110;
  local_d0->insert_len_ = uVar37;
  local_d0->copy_len_ = iVar21 << 0x19 | (uint)local_138;
  uVar30 = (ulong)(params->dist).num_direct_distance_codes;
  uVar27 = uVar30 + 0x10;
  uVar9 = 0;
  if (uVar27 <= uVar45) {
    uVar41 = (params->dist).distance_postfix_bits;
    bVar16 = (byte)uVar41;
    uVar30 = ((4L << (bVar16 & 0x3f)) + (uVar45 - uVar30)) - 0x10;
    uVar28 = 0x1f;
    uVar10 = (uint)uVar30;
    if (uVar10 != 0) {
      for (; uVar10 >> uVar28 == 0; uVar28 = uVar28 - 1) {
      }
    }
    uVar28 = (uVar28 ^ 0xffffffe0) + 0x1f;
    uVar13 = (ulong)((uVar30 >> ((ulong)uVar28 & 0x3f) & 1) != 0);
    lVar12 = (ulong)uVar28 - (ulong)uVar41;
    uVar45 = (~(-1 << (bVar16 & 0x1f)) & uVar10) + uVar27 +
             (uVar13 + lVar12 * 2 + 0xfffe << (bVar16 & 0x3f)) | lVar12 * 0x400;
    uVar9 = (uint32_t)(uVar30 - (uVar13 + 2 << ((byte)uVar28 & 0x3f)) >> (bVar16 & 0x3f));
  }
  local_d0->dist_prefix_ = (uint16_t)uVar45;
  local_d0->dist_extra_ = uVar9;
  if (5 < local_110) {
    if (local_110 < 0x82) {
      uVar37 = 0x1f;
      uVar41 = (uint)(local_110 - 2);
      if (uVar41 != 0) {
        for (; uVar41 >> uVar37 == 0; uVar37 = uVar37 - 1) {
        }
      }
      uVar37 = (int)(local_110 - 2 >> ((char)(uVar37 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar37 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_110 < 0x842) {
      uVar41 = 0x1f;
      if (uVar37 - 0x42 != 0) {
        for (; uVar37 - 0x42 >> uVar41 == 0; uVar41 = uVar41 - 1) {
        }
      }
      uVar37 = (uVar41 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar37 = 0x15;
      if (0x1841 < local_110) {
        uVar37 = (uint)(ushort)(0x17 - (local_110 < 0x5842));
      }
    }
  }
  uVar41 = iVar21 + (uint)local_138;
  if (uVar41 < 10) {
    uVar28 = uVar41 - 2;
  }
  else if (uVar41 < 0x86) {
    uVar41 = uVar41 - 6;
    uVar28 = 0x1f;
    if (uVar41 != 0) {
      for (; uVar41 >> uVar28 == 0; uVar28 = uVar28 - 1) {
      }
    }
    uVar28 = (uVar41 >> ((char)(uVar28 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar28 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar28 = 0x17;
    if (uVar41 < 0x846) {
      uVar28 = 0x1f;
      if (uVar41 - 0x46 != 0) {
        for (; uVar41 - 0x46 >> uVar28 == 0; uVar28 = uVar28 - 1) {
        }
      }
      uVar28 = (uVar28 ^ 0xffe0) + 0x2c;
    }
  }
  uVar39 = (ushort)uVar28;
  uVar23 = (uVar39 & 7) + ((ushort)uVar37 & 7) * 8;
  if ((((uVar45 & 0x3ff) == 0) && ((ushort)uVar37 < 8)) && (uVar39 < 0x10)) {
    if (7 < uVar39) {
      uVar23 = uVar23 | 0x40;
    }
  }
  else {
    iVar18 = ((uVar37 & 0xffff) >> 3) * 3 + ((uVar28 & 0xffff) >> 3);
    uVar23 = uVar23 + ((ushort)(0x520d40 >> ((char)iVar18 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar18 * 0x40 + 0x40;
  }
  local_d0->cmd_prefix_ = uVar23;
  *num_literals = *num_literals + local_110;
  position = uVar11 + local_138;
  uVar45 = sVar31;
  if (position < sVar31) {
    uVar45 = position;
  }
  uVar27 = uVar11 + 2;
  if (local_b8 < local_138 >> 2) {
    uVar30 = position + local_b8 * -4;
    if (uVar30 < uVar27) {
      uVar30 = uVar27;
    }
    uVar27 = uVar30;
    if (uVar45 < uVar30) {
      uVar27 = uVar45;
    }
  }
  local_108 = uVar11 + lVar32 + local_138 * 2;
  local_d0 = local_d0 + 1;
  if (uVar27 < uVar45) {
    uVar23 = *(ushort *)(hasher + 0x80028);
    do {
      uVar37 = (uint)(*(int *)(ringbuffer + (uVar27 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
      uVar13 = (ulong)uVar37;
      uVar30 = uVar27 - *(uint *)(hasher + uVar13 * 4 + 0x28);
      hasher[(uVar27 & 0xffff) + 0x30028] = (uint8_t)uVar37;
      if (0xfffe < uVar30) {
        uVar30 = 0xffff;
      }
      uVar39 = uVar23 + 1;
      *(short *)(hasher + (ulong)uVar23 * 4 + 0x40028) = (short)uVar30;
      *(undefined2 *)(hasher + (ulong)uVar23 * 4 + 0x4002a) =
           *(undefined2 *)(hasher + uVar13 * 2 + 0x20028);
      *(int *)(hasher + uVar13 * 4 + 0x28) = (int)uVar27;
      *(ushort *)(hasher + uVar13 * 2 + 0x20028) = uVar23;
      uVar27 = uVar27 + 1;
      uVar23 = uVar39;
    } while (uVar45 != uVar27);
    local_110 = 0;
LAB_00114136:
    *(ushort *)(hasher + 0x80028) = uVar39;
  }
  else {
    local_110 = 0;
  }
LAB_00114142:
  uVar45 = position;
  if (uVar1 <= position + 4) goto LAB_001141bc;
  goto LAB_00112ee9;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}